

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTest.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  byte bVar2;
  bool pred;
  uint32_t uVar3;
  uint64_t uVar4;
  size_type sVar5;
  byte *pbVar6;
  uchar *md;
  string *psVar7;
  size_t n;
  size_t n_00;
  size_t n_01;
  ulong local_978;
  size_t x;
  undefined1 local_968 [8];
  string result;
  SHA256 local_928;
  undefined1 local_908 [8];
  string hash_with_nonce;
  undefined1 local_8c8 [8];
  string password_sha256_sha256;
  string local_8a0 [32];
  SHA256 local_880;
  undefined1 local_860 [8];
  string password_sha256;
  undefined1 local_838 [8];
  string nonce;
  allocator<char> local_7f1;
  string local_7f0;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  SHA256 local_788;
  string local_768;
  allocator<char> local_741;
  string local_740;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  SHA256 local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  SHA256 local_628;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  undefined1 auStack_578 [8];
  SHA256 sha256;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  SHA1 local_4bc;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  SHA1 local_414;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  SHA1 local_36c;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  undefined1 auStack_2c8 [8];
  SHA1 sha1;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  undefined1 local_218 [16];
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  undefined1 local_178 [16];
  string local_168;
  allocator<char> local_141;
  string local_140;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [16];
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 auStack_28 [8];
  MD5 md5;
  char **param_1_local;
  int param_0_local;
  
  md5._8_8_ = param_2;
  printf("-- crc32\n");
  uVar3 = phosg::crc32((void *)0x0,0,0);
  phosg::expect_generic
            (uVar3 == 0,"0x00000000 != crc32(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x18);
  uVar3 = phosg::crc32(anon_var_dwarf_2da + 0x14,0,0);
  phosg::expect_generic
            (uVar3 == 0,"0x00000000 != crc32(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x19);
  uVar3 = phosg::crc32("A",1,0);
  phosg::expect_generic
            (uVar3 == 0xd3d99e8b,"0xD3D99E8B != crc32(\"A\", 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1a);
  uVar3 = phosg::crc32("omg",3,0);
  phosg::expect_generic
            (uVar3 == 0xbf4fb41e,"0xBF4FB41E != crc32(\"omg\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1b);
  uVar3 = phosg::crc32("omg hax",7,0);
  phosg::expect_generic
            (uVar3 == 0xbb24c2e5,"0xBB24C2E5 != crc32(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1c);
  uVar3 = phosg::crc32("The quick brown fox jumps over the lazy dog",0x2b,0);
  phosg::expect_generic
            (uVar3 == 0x414fa339,
             "0x414FA339 != crc32(\"The quick brown fox jumps over the lazy dog\", 43)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1d);
  printf("-- fnv1a32\n");
  uVar3 = phosg::fnv1a32((void *)0x0,0,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0x811c9dc5,"0x811C9DC5 != fnv1a32(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x22);
  uVar3 = phosg::fnv1a32(anon_var_dwarf_2da + 0x14,0,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0x811c9dc5,"0x811C9DC5 != fnv1a32(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x23);
  uVar3 = phosg::fnv1a32("omg hax",7,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0x36e1dfd3,"0x36E1DFD3 != fnv1a32(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x24);
  uVar3 = phosg::fnv1a32("lollercoaster",0xd,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0xa73ca50,"0x0A73CA50 != fnv1a32(\"lollercoaster\", 13)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x25);
  printf("-- fnv1a64\n");
  uVar4 = phosg::fnv1a64((void *)0x0,0,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar4 == 0xcbf29ce484222325,"0xCBF29CE484222325 != fnv1a64(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2a);
  uVar4 = phosg::fnv1a64(anon_var_dwarf_2da + 0x14,0,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar4 == 0xcbf29ce484222325,"0xCBF29CE484222325 != fnv1a64(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2b);
  uVar4 = phosg::fnv1a64("omg hax",7,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar4 == 0xe6cac1f92eb65713,"0xE6CAC1F92EB65713 != fnv1a64(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2c);
  uVar4 = phosg::fnv1a64("lollercoaster",0xd,0xcbf29ce484222325);
  md = (uchar *)0x2d;
  phosg::expect_generic
            (uVar4 == 0x594b81fb565e8d30,"0x594B81FB565E8D30 != fnv1a64(\"lollercoaster\", 13)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2d);
  printf("-- md5\n");
  phosg::MD5::MD5((MD5 *)auStack_28,(uchar *)0x0,0,md);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_270,0x10,&local_49);
  phosg::MD5::bin_abi_cxx11_(&local_80,(MD5 *)auStack_28);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x33,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"D41D8CD98F00B204E9800998ECF8427E",&local_a1);
  phosg::MD5::hex_abi_cxx11_(&local_c8,(MD5 *)auStack_28);
  psVar7 = &local_c8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x34,&local_a0,psVar7);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  phosg::MD5::MD5((MD5 *)local_d8,(uchar *)(anon_var_dwarf_2da + 0x14),0,(uchar *)psVar7);
  auStack_28 = (undefined1  [8])local_d8._0_8_;
  md5.a0 = local_d8._8_4_;
  md5.b0 = local_d8._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,anon_var_dwarf_270,0x10,&local_f9);
  phosg::MD5::bin_abi_cxx11_(&local_120,(MD5 *)auStack_28);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x36,&local_f8,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"D41D8CD98F00B204E9800998ECF8427E",&local_141);
  phosg::MD5::hex_abi_cxx11_(&local_168,(MD5 *)auStack_28);
  psVar7 = &local_168;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x37,&local_140,psVar7);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  phosg::MD5::MD5((MD5 *)local_178,(uchar *)"omg hax",7,(uchar *)psVar7);
  auStack_28 = (undefined1  [8])local_178._0_8_;
  md5.a0 = local_178._8_4_;
  md5.b0 = local_178._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,anon_var_dwarf_29c,0x10,&local_199);
  phosg::MD5::bin_abi_cxx11_(&local_1c0,(MD5 *)auStack_28);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x39,&local_198,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"FAC7E18ED6599B377C60F2CA94CCB45B",&local_1e1);
  phosg::MD5::hex_abi_cxx11_(&local_208,(MD5 *)auStack_28);
  psVar7 = &local_208;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3a,&local_1e0,psVar7);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  phosg::MD5::MD5((MD5 *)local_218,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
                  (uchar *)psVar7);
  auStack_28 = (undefined1  [8])local_218._0_8_;
  md5.a0 = local_218._8_4_;
  md5.b0 = local_218._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,anon_var_dwarf_2b0,0x10,&local_239);
  phosg::MD5::bin_abi_cxx11_(&local_260,(MD5 *)auStack_28);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3c,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"9E107D9D372BB6826BD81D3542A419D6",&local_281);
  phosg::MD5::hex_abi_cxx11_(&local_2a8,(MD5 *)auStack_28);
  psVar7 = &local_2a8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3d,&local_280,psVar7);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  printf("-- sha1\n");
  phosg::SHA1::SHA1((SHA1 *)auStack_2c8,(uchar *)0x0,0,(uchar *)psVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,anon_var_dwarf_2da,0x14,&local_2e9);
  phosg::SHA1::bin_abi_cxx11_(&local_310,(SHA1 *)auStack_2c8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x43,&local_2e8,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"DA39A3EE5E6B4B0D3255BFEF95601890AFD80709",&local_331);
  phosg::SHA1::hex_abi_cxx11_(&local_358,(SHA1 *)auStack_2c8);
  psVar7 = &local_358;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x44,&local_330,psVar7);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  phosg::SHA1::SHA1(&local_36c,(uchar *)(anon_var_dwarf_2da + 0x14),0,(uchar *)psVar7);
  sha1.h[2] = local_36c.h[4];
  auStack_2c8._0_4_ = local_36c.h[0];
  auStack_2c8._4_4_ = local_36c.h[1];
  sha1.h[0] = local_36c.h[2];
  sha1.h[1] = local_36c.h[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,anon_var_dwarf_2da,0x14,&local_391);
  phosg::SHA1::bin_abi_cxx11_(&local_3b8,(SHA1 *)auStack_2c8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x46,&local_390,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"DA39A3EE5E6B4B0D3255BFEF95601890AFD80709",&local_3d9);
  phosg::SHA1::hex_abi_cxx11_(&local_400,(SHA1 *)auStack_2c8);
  psVar7 = &local_400;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x47,&local_3d8,psVar7);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  phosg::SHA1::SHA1(&local_414,(uchar *)"omg hax",7,(uchar *)psVar7);
  sha1.h[2] = local_414.h[4];
  auStack_2c8._0_4_ = local_414.h[0];
  auStack_2c8._4_4_ = local_414.h[1];
  sha1.h[0] = local_414.h[2];
  sha1.h[1] = local_414.h[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,anon_var_dwarf_2ee,0x14,&local_439);
  phosg::SHA1::bin_abi_cxx11_(&local_460,(SHA1 *)auStack_2c8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x49,&local_438,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"6A30D0343ED1313696D20BCC25FA7E2AD5A9777F",&local_481);
  phosg::SHA1::hex_abi_cxx11_(&local_4a8,(SHA1 *)auStack_2c8);
  psVar7 = &local_4a8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4a,&local_480,psVar7);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  phosg::SHA1::SHA1(&local_4bc,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
                    (uchar *)psVar7);
  sha1.h[2] = local_4bc.h[4];
  auStack_2c8._0_4_ = local_4bc.h[0];
  auStack_2c8._4_4_ = local_4bc.h[1];
  sha1.h[0] = local_4bc.h[2];
  sha1.h[1] = local_4bc.h[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,anon_var_dwarf_302,0x14,&local_4e1);
  phosg::SHA1::bin_abi_cxx11_(&local_508,(SHA1 *)auStack_2c8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4c,&local_4e0,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"2FD4E1C67A2D28FCED849EE1BB76E7391B93EB12",&local_529);
  phosg::SHA1::hex_abi_cxx11_(&local_550,(SHA1 *)auStack_2c8);
  psVar7 = &local_550;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4d,&local_528,psVar7);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  printf("-- sha256\n");
  phosg::SHA256::SHA256((SHA256 *)auStack_578,(uchar *)0x0,0,(uchar *)psVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,anon_var_dwarf_320,0x20,&local_599);
  phosg::SHA256::bin_abi_cxx11_(&local_5c0,(SHA256 *)auStack_578);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x53,&local_598,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855"
             ,&local_5e1);
  phosg::SHA256::hex_abi_cxx11_(&local_608,(SHA256 *)auStack_578);
  psVar7 = &local_608;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x54,&local_5e0,psVar7);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  phosg::SHA256::SHA256(&local_628,(uchar *)(anon_var_dwarf_2da + 0x14),0,(uchar *)psVar7);
  sha256.h[2] = local_628.h[4];
  sha256.h[3] = local_628.h[5];
  sha256.h[4] = local_628.h[6];
  sha256.h[5] = local_628.h[7];
  auStack_578._0_4_ = local_628.h[0];
  auStack_578._4_4_ = local_628.h[1];
  sha256.h[0] = local_628.h[2];
  sha256.h[1] = local_628.h[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_648,anon_var_dwarf_320,0x20,&local_649);
  phosg::SHA256::bin_abi_cxx11_(&local_670,(SHA256 *)auStack_578);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x56,&local_648,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855"
             ,&local_691);
  phosg::SHA256::hex_abi_cxx11_(&local_6b8,(SHA256 *)auStack_578);
  psVar7 = &local_6b8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x57,&local_690,psVar7);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  phosg::SHA256::SHA256(&local_6d8,(uchar *)"omg hax",7,(uchar *)psVar7);
  sha256.h[2] = local_6d8.h[4];
  sha256.h[3] = local_6d8.h[5];
  sha256.h[4] = local_6d8.h[6];
  sha256.h[5] = local_6d8.h[7];
  auStack_578._0_4_ = local_6d8.h[0];
  auStack_578._4_4_ = local_6d8.h[1];
  sha256.h[0] = local_6d8.h[2];
  sha256.h[1] = local_6d8.h[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f8,anon_var_dwarf_340,0x20,&local_6f9);
  phosg::SHA256::bin_abi_cxx11_(&local_720,(SHA256 *)auStack_578);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x59,&local_6f8,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,"C8FE9095163892367A31CEC89025A8D8394B474D388F10D47A0FCC0219A77430"
             ,&local_741);
  phosg::SHA256::hex_abi_cxx11_(&local_768,(SHA256 *)auStack_578);
  psVar7 = &local_768;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5a,&local_740,psVar7);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  phosg::SHA256::SHA256
            (&local_788,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,(uchar *)psVar7)
  ;
  sha256.h[2] = local_788.h[4];
  sha256.h[3] = local_788.h[5];
  sha256.h[4] = local_788.h[6];
  sha256.h[5] = local_788.h[7];
  auStack_578._0_4_ = local_788.h[0];
  auStack_578._4_4_ = local_788.h[1];
  sha256.h[0] = local_788.h[2];
  sha256.h[1] = local_788.h[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,anon_var_dwarf_354,0x20,&local_7a9);
  phosg::SHA256::bin_abi_cxx11_(&local_7d0,(SHA256 *)auStack_578);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5c,&local_7a8,&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"D7A8FBB307D7809469CA9ABCB0082E4F8D5651E46D3CDB762D02D0BF37C9E592"
             ,&local_7f1);
  phosg::SHA256::hex_abi_cxx11_((string *)((long)&nonce.field_2 + 8),(SHA256 *)auStack_578);
  psVar7 = (string *)((long)&nonce.field_2 + 8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5d,&local_7f0,psVar7);
  std::__cxx11::string::~string((string *)(nonce.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_838,"\x15R\x16p\x06u\"\x18wCS\x14q\x01C%S\x1fj\x14",
             (allocator<char> *)(password_sha256.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(password_sha256.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a0,"root",(allocator<char> *)(password_sha256_sha256.field_2._M_local_buf + 0xf)
            );
  phosg::SHA256::SHA256(&local_880,(uchar *)local_8a0,n,(uchar *)psVar7);
  phosg::SHA256::bin_abi_cxx11_((string *)local_860,&local_880);
  std::__cxx11::string::~string(local_8a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(password_sha256_sha256.field_2._M_local_buf + 0xf));
  phosg::SHA256::SHA256
            ((SHA256 *)((long)&hash_with_nonce.field_2 + 8),local_860,n_00,(uchar *)psVar7);
  phosg::SHA256::bin_abi_cxx11_((string *)local_8c8,(SHA256 *)((long)&hash_with_nonce.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&result.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838);
  phosg::SHA256::SHA256(&local_928,(uchar *)(result.field_2._M_local_buf + 8),n_01,(uchar *)psVar7);
  phosg::SHA256::bin_abi_cxx11_((string *)local_908,&local_928);
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_968,0x20,'\0',(allocator<char> *)((long)&x + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 7));
  local_978 = 0;
  while( true ) {
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_968);
    if (sVar5 <= local_978) break;
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_860,local_978);
    bVar1 = *pbVar6;
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_908,local_978);
    bVar2 = *pbVar6;
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_968,local_978);
    *pbVar6 = bVar1 ^ bVar2;
    local_978 = local_978 + 1;
  }
  pred = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_968,anon_var_dwarf_388);
  phosg::expect_generic
            (pred,
             "result != \"\\x1A\\xE1\\x80\\xD5\\xE5\\xDB\\x7F\\xDF\\x59\\xEA\\x73\\x91\\xB6\\x5E\\x25\\x16\\x73\\xE1\\xB0\\x01\\xC1\\x50\\xAA\\x3A\\x48\\xDC\\x78\\x48\\x8B\\x4B\\x70\\xC4\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x68);
  std::__cxx11::string::~string((string *)local_968);
  std::__cxx11::string::~string((string *)local_908);
  std::__cxx11::string::~string((string *)local_8c8);
  std::__cxx11::string::~string((string *)local_860);
  std::__cxx11::string::~string((string *)local_838);
  printf("HashTest: all tests passed\n");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    printf("-- crc32\n");
    expect_eq(0x00000000, crc32(nullptr, 0));
    expect_eq(0x00000000, crc32("", 0));
    expect_eq(0xD3D99E8B, crc32("A", 1));
    expect_eq(0xBF4FB41E, crc32("omg", 3));
    expect_eq(0xBB24C2E5, crc32("omg hax", 7));
    expect_eq(0x414FA339, crc32("The quick brown fox jumps over the lazy dog", 43));
  }

  {
    printf("-- fnv1a32\n");
    expect_eq(0x811C9DC5, fnv1a32(nullptr, 0)); // technically undefined, but should work
    expect_eq(0x811C9DC5, fnv1a32("", 0));
    expect_eq(0x36E1DFD3, fnv1a32("omg hax", 7));
    expect_eq(0x0A73CA50, fnv1a32("lollercoaster", 13));
  }

  {
    printf("-- fnv1a64\n");
    expect_eq(0xCBF29CE484222325, fnv1a64(nullptr, 0)); // technically undefined, but should work
    expect_eq(0xCBF29CE484222325, fnv1a64("", 0));
    expect_eq(0xE6CAC1F92EB65713, fnv1a64("omg hax", 7));
    expect_eq(0x594B81FB565E8D30, fnv1a64("lollercoaster", 13));
  }

  {
    printf("-- md5\n");
    MD5 md5(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xD4\x1D\x8C\xD9\x8F\x00\xB2\x04\xE9\x80\x09\x98\xEC\xF8\x42\x7E", 16), md5.bin());
    check_string(__FILE__, __LINE__, "D41D8CD98F00B204E9800998ECF8427E", md5.hex());
    md5 = MD5("", 0);
    check_string(__FILE__, __LINE__, string("\xD4\x1D\x8C\xD9\x8F\x00\xB2\x04\xE9\x80\x09\x98\xEC\xF8\x42\x7E", 16), md5.bin());
    check_string(__FILE__, __LINE__, "D41D8CD98F00B204E9800998ECF8427E", md5.hex());
    md5 = MD5("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\xFA\xC7\xE1\x8E\xD6\x59\x9B\x37\x7C\x60\xF2\xCA\x94\xCC\xB4\x5B", 16), md5.bin());
    check_string(__FILE__, __LINE__, "FAC7E18ED6599B377C60F2CA94CCB45B", md5.hex());
    md5 = MD5("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\x9E\x10\x7D\x9D\x37\x2B\xB6\x82\x6B\xD8\x1D\x35\x42\xA4\x19\xD6", 16), md5.bin());
    check_string(__FILE__, __LINE__, "9E107D9D372BB6826BD81D3542A419D6", md5.hex());
  }

  {
    printf("-- sha1\n");
    SHA1 sha1(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xDA\x39\xA3\xEE\x5E\x6B\x4B\x0D\x32\x55\xBF\xEF\x95\x60\x18\x90\xAF\xD8\x07\x09", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "DA39A3EE5E6B4B0D3255BFEF95601890AFD80709", sha1.hex());
    sha1 = SHA1("", 0);
    check_string(__FILE__, __LINE__, string("\xDA\x39\xA3\xEE\x5E\x6B\x4B\x0D\x32\x55\xBF\xEF\x95\x60\x18\x90\xAF\xD8\x07\x09", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "DA39A3EE5E6B4B0D3255BFEF95601890AFD80709", sha1.hex());
    sha1 = SHA1("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\x6A\x30\xD0\x34\x3E\xD1\x31\x36\x96\xD2\x0B\xCC\x25\xFA\x7E\x2A\xD5\xA9\x77\x7F", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "6A30D0343ED1313696D20BCC25FA7E2AD5A9777F", sha1.hex());
    sha1 = SHA1("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\x2F\xD4\xE1\xC6\x7A\x2D\x28\xFC\xED\x84\x9E\xE1\xBB\x76\xE7\x39\x1B\x93\xEB\x12", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "2FD4E1C67A2D28FCED849EE1BB76E7391B93EB12", sha1.hex());
  }

  {
    printf("-- sha256\n");
    SHA256 sha256(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xE3\xB0\xC4\x42\x98\xFC\x1C\x14\x9A\xFB\xF4\xC8\x99\x6F\xB9\x24\x27\xAE\x41\xE4\x64\x9B\x93\x4C\xA4\x95\x99\x1B\x78\x52\xB8\x55", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855", sha256.hex());
    sha256 = SHA256("", 0);
    check_string(__FILE__, __LINE__, string("\xE3\xB0\xC4\x42\x98\xFC\x1C\x14\x9A\xFB\xF4\xC8\x99\x6F\xB9\x24\x27\xAE\x41\xE4\x64\x9B\x93\x4C\xA4\x95\x99\x1B\x78\x52\xB8\x55", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855", sha256.hex());
    sha256 = SHA256("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\xC8\xFE\x90\x95\x16\x38\x92\x36\x7A\x31\xCE\xC8\x90\x25\xA8\xD8\x39\x4B\x47\x4D\x38\x8F\x10\xD4\x7A\x0F\xCC\x02\x19\xA7\x74\x30", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "C8FE9095163892367A31CEC89025A8D8394B474D388F10D47A0FCC0219A77430", sha256.hex());
    sha256 = SHA256("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\xD7\xA8\xFB\xB3\x07\xD7\x80\x94\x69\xCA\x9A\xBC\xB0\x08\x2E\x4F\x8D\x56\x51\xE4\x6D\x3C\xDB\x76\x2D\x02\xD0\xBF\x37\xC9\xE5\x92", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "D7A8FBB307D7809469CA9ABCB0082E4F8D5651E46D3CDB762D02D0BF37C9E592", sha256.hex());

    // MySQL caching_sha2_password challenge/response test (password = "root")
    string nonce = "\x15\x52\x16\x70\x06\x75\x22\x18\x77\x43\x53\x14\x71\x01\x43\x25\x53\x1F\x6A\x14";
    string password_sha256 = SHA256("root").bin();
    string password_sha256_sha256 = SHA256(password_sha256).bin();
    string hash_with_nonce = SHA256(password_sha256_sha256 + nonce).bin();
    string result(0x20, '\0');
    for (size_t x = 0; x < result.size(); x++) {
      result[x] = password_sha256[x] ^ hash_with_nonce[x];
    }
    expect_eq(result, "\x1A\xE1\x80\xD5\xE5\xDB\x7F\xDF\x59\xEA\x73\x91\xB6\x5E\x25\x16\x73\xE1\xB0\x01\xC1\x50\xAA\x3A\x48\xDC\x78\x48\x8B\x4B\x70\xC4");
  }

  printf("HashTest: all tests passed\n");
  return 0;
}